

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Track::GetFirst(Track *this,BlockEntry **pBlockEntry)

{
  Segment *pSVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  Cluster *this_00;
  int iVar5;
  BlockEntry *pBVar6;
  BlockEntry *pNextEntry;
  
  pSVar1 = this->m_pSegment;
  if ((pSVar1->m_clusters == (Cluster **)0x0) || (pSVar1->m_clusterCount < 1)) {
    this_00 = &pSVar1->m_eos;
  }
  else {
    this_00 = *pSVar1->m_clusters;
  }
  iVar5 = 0;
  do {
    if (this_00 == (Cluster *)0x0) {
LAB_00155667:
      *pBlockEntry = &(this->m_eos).super_BlockEntry;
      return 1;
    }
    if (this_00->m_pSegment == (Segment *)0x0) {
      bVar2 = Segment::DoneParsing(this->m_pSegment);
      if (!bVar2) {
        *pBlockEntry = (BlockEntry *)0x0;
        return -3;
      }
      goto LAB_00155667;
    }
    lVar4 = Cluster::GetFirst(this_00,pBlockEntry);
    if (lVar4 < 0) {
      return lVar4;
    }
    pBVar6 = *pBlockEntry;
    if (*pBlockEntry != (BlockEntry *)0x0) {
      while( true ) {
        iVar3 = (*pBVar6->_vptr_BlockEntry[2])();
        if ((*(long *)(CONCAT44(extraout_var,iVar3) + 0x10) == (this->m_info).number) &&
           (iVar3 = (*this->_vptr_Track[2])(this,*pBlockEntry), (char)iVar3 != '\0')) {
          return 0;
        }
        lVar4 = Cluster::GetNext(this_00,*pBlockEntry,&pNextEntry);
        if (lVar4 < 0) {
          return lVar4;
        }
        if (pNextEntry == (BlockEntry *)0x0) break;
        *pBlockEntry = pNextEntry;
        pBVar6 = pNextEntry;
      }
      if (0x62 < iVar5) goto LAB_00155667;
      iVar5 = iVar5 + 1;
    }
    this_00 = Segment::GetNext(this->m_pSegment,this_00);
  } while( true );
}

Assistant:

long Track::GetFirst(const BlockEntry*& pBlockEntry) const {
  const Cluster* pCluster = m_pSegment->GetFirst();

  for (int i = 0;;) {
    if (pCluster == NULL) {
      pBlockEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pBlockEntry = GetEOS();
        return 1;
      }

      pBlockEntry = 0;
      return E_BUFFER_NOT_FULL;
    }

    long status = pCluster->GetFirst(pBlockEntry);

    if (status < 0)  // error
      return status;

    if (pBlockEntry == 0) {  // empty cluster
      pCluster = m_pSegment->GetNext(pCluster);
      continue;
    }

    for (;;) {
      const Block* const pBlock = pBlockEntry->GetBlock();
      assert(pBlock);

      const long long tn = pBlock->GetTrackNumber();

      if ((tn == m_info.number) && VetEntry(pBlockEntry))
        return 0;

      const BlockEntry* pNextEntry;

      status = pCluster->GetNext(pBlockEntry, pNextEntry);

      if (status < 0)  // error
        return status;

      if (pNextEntry == 0)
        break;

      pBlockEntry = pNextEntry;
    }

    ++i;

    if (i >= 100)
      break;

    pCluster = m_pSegment->GetNext(pCluster);
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number.  We interpret that as an error (which
  // might be too conservative).

  pBlockEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}